

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_common.cpp
# Opt level: O0

void __thiscall myutils::SharedSemaphore::~SharedSemaphore(SharedSemaphore *this)

{
  SharedSemaphore *this_local;
  
  if ((this->m_sem != (sem_t *)0x0) && (this->m_sem != (sem_t *)0x0)) {
    if (this->m_sem == &this->m_unamed_sem) {
      sem_destroy((sem_t *)this->m_sem);
    }
    else {
      sem_close((sem_t *)this->m_sem);
    }
  }
  return;
}

Assistant:

SharedSemaphore::~SharedSemaphore()
{
#ifdef _WIN32
    if (m_hSemaphore) CloseHandle(m_hSemaphore);
#elif defined(__linux__)
    if (m_sem && m_sem != SEM_FAILED) {
        if (m_sem == &m_unamed_sem)
            sem_destroy(m_sem);
        else
            sem_close(m_sem);
    }
#endif
}